

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

object * slot_object(player *p,wchar_t slot)

{
  equip_slot *peVar1;
  object *poVar2;
  
  if ((slot < L'\0') || ((uint)(p->body).count <= (uint)slot)) {
    __assert_fail("slot >= 0 && slot < p->body.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                  ,0x76,"struct object *slot_object(struct player *, int)");
  }
  peVar1 = (p->body).slots;
  if ((peVar1 != (equip_slot *)0x0) && (poVar2 = peVar1[(uint)slot].obj, poVar2 != (object *)0x0)) {
    return poVar2;
  }
  return (object *)0x0;
}

Assistant:

struct object *slot_object(struct player *p, int slot)
{
	/* Check bounds */
	assert(slot >= 0 && slot < p->body.count);

	/* Ensure a valid body */
	if (p->body.slots && p->body.slots[slot].obj) {
		return p->body.slots[slot].obj;
	}

	return NULL;
}